

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O0

Value * __thiscall
wabt::Decompiler::Get<(wabt::ExprType)20>
          (Value *__return_storage_ptr__,Decompiler *this,VarExpr<(wabt::ExprType)20> *ve)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8a;
  allocator<char> local_89;
  string_view local_88;
  string_view local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  iterator local_48;
  size_type local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  VarExpr<(wabt::ExprType)20> *local_20;
  VarExpr<(wabt::ExprType)20> *ve_local;
  Decompiler *this_local;
  
  local_20 = ve;
  ve_local = (VarExpr<(wabt::ExprType)20> *)this;
  this_local = (Decompiler *)__return_storage_ptr__;
  this_00 = Var::name_abi_cxx11_(&ve->var);
  local_88 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
  local_78 = VarName(this,local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_68,&local_78,&local_89);
  local_48 = &local_68;
  local_40 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_8a);
  __l._M_len = local_40;
  __l._M_array = local_48;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_38,__l,&local_8a);
  Value::Value(__return_storage_ptr__,&local_38,Atomic);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_8a);
  local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48;
  do {
    local_98 = local_98 + -1;
    std::__cxx11::string::~string((string *)local_98);
  } while (local_98 != &local_68);
  std::allocator<char>::~allocator(&local_89);
  return __return_storage_ptr__;
}

Assistant:

Value Get(const VarExpr<T>& ve) {
    return Value{{std::string(VarName(ve.var.name()))}, Precedence::Atomic};
  }